

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolordialog.cpp
# Opt level: O0

void __thiscall QtPrivate::QColorPicker::setCol(QColorPicker *this,int h,int s)

{
  int iVar1;
  int *piVar2;
  QColorPicker *in_RDI;
  long in_FS_OFFSET;
  int nsat;
  int nhue;
  QRect r;
  int in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff4c;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  int iVar3;
  QColorPicker *this_00;
  QRect *in_stack_ffffffffffffff70;
  int local_20 [5];
  int local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_20[3] = 0;
  this_00 = in_RDI;
  piVar2 = qMax<int>(local_20 + 3,&local_c);
  local_20[2] = 0x167;
  piVar2 = qMin<int>(piVar2,local_20 + 2);
  iVar1 = *piVar2;
  local_20[1] = 0;
  piVar2 = qMax<int>(local_20 + 1,local_20 + 4);
  local_20[0] = 0xff;
  piVar2 = qMin<int>(piVar2,local_20);
  iVar3 = *piVar2;
  if ((iVar1 != in_RDI->hue) || (iVar3 != in_RDI->sat)) {
    colPt(this_00);
    QSize::QSize((QSize *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                 in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48);
    QRect::QRect(in_stack_ffffffffffffff70,(QPoint *)this_00,(QSize *)CONCAT44(iVar1,iVar3));
    in_RDI->hue = iVar1;
    in_RDI->sat = iVar3;
    colPt(this_00);
    QSize::QSize((QSize *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                 in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48);
    QRect::QRect(in_stack_ffffffffffffff70,(QPoint *)this_00,(QSize *)CONCAT44(iVar1,iVar3));
    QRect::united((QRect *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                  (QRect *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    QWidget::contentsRect((QWidget *)in_RDI);
    iVar1 = QRect::x((QRect *)0x73337d);
    iVar1 = iVar1 + -9;
    QWidget::contentsRect((QWidget *)in_RDI);
    QRect::y((QRect *)0x7333a2);
    QRect::translate((QRect *)CONCAT44(iVar1,in_stack_ffffffffffffff50),in_stack_ffffffffffffff4c,
                     in_stack_ffffffffffffff48);
    QWidget::repaint((QWidget *)in_RDI,(QRect *)CONCAT44(iVar1,in_stack_ffffffffffffff50));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QColorPicker::setCol(int h, int s)
{
    int nhue = qMin(qMax(0,h), 359);
    int nsat = qMin(qMax(0,s), 255);
    if (nhue == hue && nsat == sat)
        return;

    QRect r(colPt(), QSize(20,20));
    hue = nhue; sat = nsat;
    r = r.united(QRect(colPt(), QSize(20,20)));
    r.translate(contentsRect().x()-9, contentsRect().y()-9);
    //    update(r);
    repaint(r);
}